

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticitiesAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imf_3_3::Chromaticities>::readValueFrom
          (TypedAttribute<Imf_3_3::Chromaticities> *this,IStream *is,int size,int version)

{
  IStream *in_RDI;
  float *in_stack_ffffffffffffffd8;
  
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

IMF_EXPORT void
ChromaticitiesAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.red.x);
    Xdr::read<StreamIO> (is, _value.red.y);
    Xdr::read<StreamIO> (is, _value.green.x);
    Xdr::read<StreamIO> (is, _value.green.y);
    Xdr::read<StreamIO> (is, _value.blue.x);
    Xdr::read<StreamIO> (is, _value.blue.y);
    Xdr::read<StreamIO> (is, _value.white.x);
    Xdr::read<StreamIO> (is, _value.white.y);
}